

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O3

Vector3f pbrt::SampleHenyeyGreenstein(Vector3f *wo,Float g,Point2f *u,Float *pdf)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  Vector3f VVar19;
  float local_3c;
  
  auVar14._4_60_ = in_register_00001204;
  auVar14._0_4_ = g;
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar13 = auVar14._0_16_;
  auVar9 = vandps_avx512vl(auVar13,auVar9);
  if (0.001 <= auVar9._0_4_) {
    auVar10 = vfnmadd231ss_fma(ZEXT416((uint)(g + 1.0)),ZEXT416((uint)(g + g)),
                               ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).x));
    auVar7 = vfnmadd213ss_fma(auVar13,auVar13,SUB6416(ZEXT464(0x3f800000),0));
    auVar9 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar13,auVar13);
    auVar10._0_4_ = auVar7._0_4_ / auVar10._0_4_;
    auVar10._4_12_ = auVar7._4_12_;
    auVar9 = vfnmadd231ss_fma(auVar9,auVar10,auVar10);
    auVar7._8_4_ = 0x80000000;
    auVar7._0_8_ = 0x8000000080000000;
    auVar7._12_4_ = 0x80000000;
    auVar9 = vxorps_avx512vl(auVar9,auVar7);
    local_3c = auVar9._0_4_ / (g + g);
  }
  else {
    auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),
                             ZEXT416((uint)(u->super_Tuple2<pbrt::Point2,_float>).x),
                             ZEXT416(0x3f800000));
    local_3c = auVar9._0_4_;
  }
  fVar12 = (u->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  fVar1 = (wo->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar2 = (wo->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar3 = (wo->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar11 = cosf(fVar12);
  fVar12 = sinf(fVar12);
  if (pdf != (Float *)0x0) {
    auVar9 = vfmadd213ss_fma(auVar13,auVar13,SUB6416(ZEXT464(0x3f800000),0));
    auVar7 = vfnmadd213ss_fma(auVar13,auVar13,SUB6416(ZEXT464(0x3f800000),0));
    auVar13 = vfmadd213ss_fma(ZEXT416((uint)(g + g)),ZEXT416((uint)local_3c),auVar9);
    auVar9 = vmaxss_avx(auVar13,ZEXT816(0) << 0x20);
    auVar9 = vsqrtss_avx(auVar9,auVar9);
    *pdf = (auVar7._0_4_ * 0.07957747) / (auVar13._0_4_ * auVar9._0_4_);
  }
  auVar13._8_4_ = 0x3f800000;
  auVar13._0_8_ = 0x3f8000003f800000;
  auVar13._12_4_ = 0x3f800000;
  auVar15._8_4_ = 0x80000000;
  auVar15._0_8_ = 0x8000000080000000;
  auVar15._12_4_ = 0x80000000;
  auVar18 = ZEXT416((uint)local_3c);
  uVar5 = vcmpss_avx512f(auVar18,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar6 = (bool)((byte)uVar5 & 1);
  auVar9 = vfnmadd213ss_fma(ZEXT416((uint)local_3c),auVar18,auVar13);
  auVar10 = vpternlogd_avx512vl(auVar13,ZEXT416((uint)fVar1),auVar15,0xf8);
  fVar16 = auVar10._0_4_;
  auVar9 = vmaxss_avx(auVar9,ZEXT816(0) << 0x40);
  fVar17 = -1.0 / (fVar1 + fVar16);
  auVar9 = vsqrtss_avx(auVar9,auVar9);
  auVar7 = vfmadd213ss_fma(ZEXT416((uint)(fVar2 * fVar2 * fVar16)),ZEXT416((uint)fVar17),auVar13);
  auVar9 = vminss_avx(auVar13,auVar9);
  fVar11 = auVar9._0_4_ * fVar11;
  auVar13 = vminss_avx(auVar13,auVar18);
  fVar12 = auVar9._0_4_ * fVar12;
  fVar4 = fVar2 * fVar3 * fVar17;
  fVar8 = (float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar13._0_4_);
  auVar9 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * fVar3)),ZEXT416((uint)fVar17),auVar10);
  auVar9 = vinsertps_avx(ZEXT416((uint)(fVar2 * fVar8 + fVar4 * fVar12 + auVar7._0_4_ * fVar11)),
                         ZEXT416((uint)(fVar3 * fVar8 +
                                       fVar11 * fVar16 * fVar4 + auVar9._0_4_ * fVar12)),0x10);
  VVar19.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar9._0_8_;
  VVar19.super_Tuple3<pbrt::Vector3,_float>.z =
       fVar1 * fVar8 + (fVar2 * -fVar16 * fVar11 - fVar3 * fVar12);
  return (Vector3f)VVar19.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

Vector3f SampleHenyeyGreenstein(const Vector3f &wo, Float g, const Point2f &u,
                                Float *pdf) {
    // Compute $\cos \theta$ for Henyey--Greenstein sample
    Float cosTheta;
    if (std::abs(g) < 1e-3)
        cosTheta = 1 - 2 * u[0];
    else {
        Float sqrTerm = (1 - g * g) / (1 + g - 2 * g * u[0]);
        cosTheta = -(1 + g * g - sqrTerm * sqrTerm) / (2 * g);
    }

    // Compute direction _wi_ for Henyey--Greenstein sample
    Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
    Float phi = 2 * Pi * u[1];
    Frame wFrame = Frame::FromZ(wo);
    Vector3f wi = wFrame.FromLocal(SphericalDirection(sinTheta, cosTheta, phi));

    if (pdf)
        *pdf = HenyeyGreenstein(cosTheta, g);
    return wi;
}